

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O1

void __thiscall pybind11::dict::dict(dict *this,object *o)

{
  PyObject *tmp;
  PyObject *op;
  error_already_set *this_00;
  
  op = (o->super_handle).m_ptr;
  if ((op == (PyObject *)0x0) || ((op->ob_type->tp_flags & 0x20000000) == 0)) {
    op = raw_dict(op);
  }
  else {
    (o->super_handle).m_ptr = (PyObject *)0x0;
  }
  (this->super_object).super_handle.m_ptr = op;
  if (op != (PyObject *)0x0) {
    return;
  }
  this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
  error_already_set::error_already_set(this_00);
  __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

dict() : object(PyDict_New(), stolen_t{}) {
        if (!m_ptr) pybind11_fail("Could not allocate dict object!");
    }